

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O0

string * (anonymous_namespace)::loadString_abi_cxx11_
                   (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                    *is,size_t len)

{
  pointer pbVar1;
  char *pcVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  string *in_RDI;
  vector<char,_std::allocator<char>_> tmp;
  allocator_type *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  allocator *paVar4;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator local_45 [20];
  allocator<char> local_31;
  vector<char,_std::allocator<char>_> local_30 [2];
  
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<char>::~allocator(&local_31);
  pbVar1 = std::
           unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                         *)0x106895);
  pvVar3 = local_30;
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1068a9);
  std::vector<char,_std::allocator<char>_>::size(pvVar3);
  std::istream::read((char *)pbVar1,(long)pcVar2);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1068db);
  pvVar3 = (vector<char,_std::allocator<char>_> *)
           std::vector<char,_std::allocator<char>_>::size(local_30);
  paVar4 = local_45;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar2,(ulong)pvVar3,paVar4);
  std::allocator<char>::~allocator((allocator<char> *)local_45);
  std::vector<char,_std::allocator<char>_>::~vector(pvVar3);
  return in_RDI;
}

Assistant:

std::string loadString(std::unique_ptr<std::istream>& is, size_t len) {
  std::vector<char> tmp(len);
  is->read(tmp.data(), tmp.size());
  return std::string(tmp.data(), tmp.size());
}